

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswBmc.c
# Opt level: O0

Aig_Obj_t * Ssw_BmcUnroll_rec(Ssw_Frm_t *pFrm,Aig_Obj_t *pObj,int f)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *p1;
  Aig_Obj_t *pRes1;
  Aig_Obj_t *pRes0;
  Aig_Obj_t *pRes;
  int f_local;
  Aig_Obj_t *pObj_local;
  Ssw_Frm_t *pFrm_local;
  
  pFrm_local = (Ssw_Frm_t *)Ssw_ObjFrame_(pFrm,pObj,f);
  if ((Aig_Obj_t *)pFrm_local == (Aig_Obj_t *)0x0) {
    iVar1 = Aig_ObjIsConst1(pObj);
    if (iVar1 == 0) {
      iVar1 = Saig_ObjIsPi(pFrm->pAig,pObj);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsCo(pObj);
        if (iVar1 == 0) {
          iVar1 = Saig_ObjIsLo(pFrm->pAig,pObj);
          if (iVar1 == 0) {
            iVar1 = Aig_ObjIsNode(pObj);
            if (iVar1 == 0) {
              __assert_fail("Aig_ObjIsNode(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswBmc.c"
                            ,0x44,"Aig_Obj_t *Ssw_BmcUnroll_rec(Ssw_Frm_t *, Aig_Obj_t *, int)");
            }
            pAVar2 = Aig_ObjFanin0(pObj);
            Ssw_BmcUnroll_rec(pFrm,pAVar2,f);
            pAVar2 = Aig_ObjFanin1(pObj);
            Ssw_BmcUnroll_rec(pFrm,pAVar2,f);
            pAVar2 = Ssw_ObjChild0Fra_(pFrm,pObj,f);
            p1 = Ssw_ObjChild1Fra_(pFrm,pObj,f);
            pRes0 = Aig_And(pFrm->pFrames,pAVar2,p1);
          }
          else if (f == 0) {
            pRes0 = Aig_ManConst0(pFrm->pFrames);
          }
          else {
            pAVar2 = Saig_ObjLoToLi(pFrm->pAig,pObj);
            pRes0 = Ssw_BmcUnroll_rec(pFrm,pAVar2,f + -1);
          }
        }
        else {
          pAVar2 = Aig_ObjFanin0(pObj);
          Ssw_BmcUnroll_rec(pFrm,pAVar2,f);
          pRes0 = Ssw_ObjChild0Fra_(pFrm,pObj,f);
        }
      }
      else {
        pRes0 = Aig_ObjCreateCi(pFrm->pFrames);
      }
    }
    else {
      pRes0 = Aig_ManConst1(pFrm->pFrames);
    }
    Ssw_ObjSetFrame_(pFrm,pObj,f,pRes0);
    pFrm_local = (Ssw_Frm_t *)pRes0;
  }
  return (Aig_Obj_t *)pFrm_local;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Incrementally unroll the timeframes.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Obj_t * Ssw_BmcUnroll_rec( Ssw_Frm_t * pFrm, Aig_Obj_t * pObj, int f )
{
    Aig_Obj_t * pRes, * pRes0, * pRes1;
    if ( (pRes = Ssw_ObjFrame_(pFrm, pObj, f)) )
        return pRes;
    if ( Aig_ObjIsConst1(pObj) )
        pRes = Aig_ManConst1( pFrm->pFrames );
    else if ( Saig_ObjIsPi(pFrm->pAig, pObj) )
        pRes = Aig_ObjCreateCi( pFrm->pFrames );
    else if ( Aig_ObjIsCo(pObj) )
    {
        Ssw_BmcUnroll_rec( pFrm, Aig_ObjFanin0(pObj), f );
        pRes = Ssw_ObjChild0Fra_( pFrm, pObj, f );
    }
    else if ( Saig_ObjIsLo(pFrm->pAig, pObj) )
    {
        if ( f == 0 )
            pRes = Aig_ManConst0( pFrm->pFrames );
        else
            pRes = Ssw_BmcUnroll_rec( pFrm, Saig_ObjLoToLi(pFrm->pAig, pObj), f-1 );
    }
    else
    {
        assert( Aig_ObjIsNode(pObj) );
        Ssw_BmcUnroll_rec( pFrm, Aig_ObjFanin0(pObj), f );
        Ssw_BmcUnroll_rec( pFrm, Aig_ObjFanin1(pObj), f );
        pRes0 = Ssw_ObjChild0Fra_( pFrm, pObj, f );
        pRes1 = Ssw_ObjChild1Fra_( pFrm, pObj, f );
        pRes = Aig_And( pFrm->pFrames, pRes0, pRes1 );
    }
    Ssw_ObjSetFrame_( pFrm, pObj, f, pRes );
    return pRes;
}